

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
::operator*=(List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
             *this,uint v)

{
  Column_support *this_00;
  uint uVar1;
  _Rb_tree_color _Var2;
  _List_node_base *p_Var3;
  Row_container *pRVar4;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
  *this_01;
  _Base_ptr p_Var5;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
  *this_02;
  _Base_ptr p_Var6;
  iterator __position;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  const_iterator __position_00;
  _Base_ptr p_Var9;
  _List_node_base *p_Var10;
  bool bVar11;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  pVar12;
  ID_index local_3c;
  _Alloc_node local_38;
  
  uVar1 = this->operators_->characteristic_;
  if (uVar1 <= v) {
    v = v % uVar1;
  }
  if (v != 1) {
    this_00 = &this->column_;
    if (v == 0) {
      for (p_Var10 = (this->column_).
                     super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var10 != (_List_node_base *)this_00; p_Var10 = p_Var10->_M_next) {
        p_Var3 = p_Var10[1]._M_next;
        pRVar4 = (this->super_Row_access_option).rows_;
        if (pRVar4 != (Row_container *)0x0) {
          p_Var5 = (pRVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &(pRVar4->_M_t)._M_impl.super__Rb_tree_header._M_header;
          if (p_Var5 != (_Base_ptr)0x0) {
            _Var2 = *(_Rb_tree_color *)&p_Var3->_M_prev;
            p_Var7 = p_Var9;
            do {
              bVar11 = p_Var5[1]._M_color < _Var2;
              if (!bVar11) {
                p_Var7 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[bVar11];
            } while (p_Var5 != (_Base_ptr)0x0);
            if ((p_Var7 != p_Var9) && (p_Var7[1]._M_color <= _Var2)) {
              p_Var9 = p_Var7;
            }
          }
          pVar12 = std::
                   _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                   ::equal_range((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                                  *)&p_Var9[1]._M_parent,(key_type *)p_Var3);
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
          ::_M_erase_aux((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                          *)&p_Var9[1]._M_parent,(_Base_ptr)pVar12.first._M_node,
                         (_Base_ptr)pVar12.second._M_node);
        }
        operator_delete(p_Var3,0xc);
      }
      std::__cxx11::
      list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
      ::clear(this_00);
    }
    else {
      for (p_Var10 = (this->column_).
                     super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var10 != (_List_node_base *)this_00; p_Var10 = p_Var10->_M_next) {
        p_Var3 = p_Var10[1]._M_next;
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this->operators_,(Element *)((long)&p_Var3->_M_next + 4),v);
        this_01 = (this->super_Row_access_option).rows_;
        if (this_01 !=
            (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
             *)0x0) {
          local_3c = *(ID_index *)&p_Var3->_M_prev;
          this_02 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
                     *)std::
                       map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
                       ::at(this_01,&local_3c);
          p_Var6 = *(_Base_ptr *)(this_02 + 0x10);
          __position_00._M_node = (_Base_ptr)(this_02 + 8);
          if (p_Var6 != (_Base_ptr)0x0) {
            _Var2 = ((Entry_column_index_option *)&p_Var3->_M_next)->columnIndex_;
            p_Var8 = __position_00._M_node;
            do {
              bVar11 = p_Var6[1]._M_color < _Var2;
              if (!bVar11) {
                p_Var8 = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[bVar11];
            } while (p_Var6 != (_Base_ptr)0x0);
            if ((p_Var8 != __position_00._M_node) && (p_Var8[1]._M_color <= _Var2)) {
              __position_00._M_node = p_Var8;
            }
          }
          __position = std::
                       _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
                       ::erase_abi_cxx11_(this_02,__position_00);
          local_38._M_t =
               (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                *)this_02;
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
          ::
          _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>::_Alloc_node>
                    (this_02,(const_iterator)__position._M_node,
                     (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                      *)p_Var3,&local_38);
        }
      }
    }
  }
  return this;
}

Assistant:

inline List_column<Master_matrix>& List_column<Master_matrix>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == 0u) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == 1u) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}